

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_351f5::ArenaTest_ReallocFastPath_Test::TestBody
          (ArenaTest_ReallocFastPath_Test *this)

{
  upb_Arena *a;
  char *pcVar1;
  char *__dest;
  char *pcVar2;
  uintptr_t extend_allocated;
  uintptr_t initial_allocated;
  void *initial;
  void *extend;
  AssertHelper AStack_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  uintptr_t local_38;
  uintptr_t local_30;
  char *local_28;
  char *local_20;
  
  a = upb_Arena_Init((void *)0x0,0x1000,&upb_alloc_global);
  pcVar2 = a->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)pcVar2) < 0x200) {
    pcVar2 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x200);
  }
  else {
    if ((char *)((ulong)(pcVar2 + 7) & 0xfffffffffffffff8) != pcVar2) goto LAB_00174be2;
    a->ptr_dont_copy_me__upb_internal_use_only = pcVar2 + 0x200;
  }
  local_28 = pcVar2;
  local_30 = upb_Arena_SpaceAllocated(a,(size_t *)0x0);
  if (pcVar2 == (char *)0x0) {
    __dest = a->ptr_dont_copy_me__upb_internal_use_only;
    pcVar1 = a->end_dont_copy_me__upb_internal_use_only;
  }
  else {
    __dest = a->ptr_dont_copy_me__upb_internal_use_only;
    pcVar1 = a->end_dont_copy_me__upb_internal_use_only;
    if (0x1ff < (ulong)((long)pcVar1 - (long)(pcVar2 + 0x200)) && pcVar2 + 0x200 == __dest) {
      a->ptr_dont_copy_me__upb_internal_use_only = __dest + 0x200;
      __dest = pcVar2;
      goto LAB_00174a57;
    }
  }
  if ((ulong)((long)pcVar1 - (long)__dest) < 0x400) {
    __dest = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,0x400);
  }
  else {
    if ((char *)((ulong)(__dest + 7) & 0xfffffffffffffff8) != __dest) {
LAB_00174be2:
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only = __dest + 0x400;
  }
  if (__dest == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    memcpy(__dest,pcVar2,0x200);
  }
LAB_00174a57:
  local_20 = __dest;
  local_38 = upb_Arena_SpaceAllocated(a,(size_t *)0x0);
  testing::internal::CmpHelperEQ<void*,void*>(local_48,"initial","extend",&local_28,&local_20);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_48,"initial_allocated","extend_allocated",&local_30,&local_38);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  upb_Arena_Free(a);
  return;
}

Assistant:

TEST(ArenaTest, ReallocFastPath) {
  upb_Arena* arena = upb_Arena_Init(nullptr, 4096, &upb_alloc_global);
  void* initial = upb_Arena_Malloc(arena, 512);
  uintptr_t initial_allocated = upb_Arena_SpaceAllocated(arena, nullptr);
  void* extend = upb_Arena_Realloc(arena, initial, 512, 1024);
  uintptr_t extend_allocated = upb_Arena_SpaceAllocated(arena, nullptr);
  EXPECT_EQ(initial, extend);
  EXPECT_EQ(initial_allocated, extend_allocated);
  upb_Arena_Free(arena);
}